

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

int nghttp2_hd_deflate_hd_bufs
              (nghttp2_hd_deflater *deflater,nghttp2_bufs *bufs,nghttp2_nv *nv,size_t nvlen)

{
  nghttp2_mem *mem;
  uint8_t *name;
  nghttp2_hd_entry *pnVar1;
  nghttp2_rcbuf *pnVar2;
  int iVar3;
  uint uVar4;
  size_t i;
  ulong table_size;
  size_t idx;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  nghttp2_hd_entry **ppnVar8;
  nghttp2_hd_entry *pnVar9;
  uint8_t **ppuVar10;
  nghttp2_nv *nv_00;
  uint indexing_mode;
  uint32_t h;
  uint32_t hash;
  nghttp2_hd_entry *pnVar11;
  ulong uVar12;
  bool bVar13;
  nghttp2_hd_nv hd_nv;
  nghttp2_hd_nv local_48;
  
  if ((deflater->ctx).bad != '\0') {
    return -0x20b;
  }
  if (deflater->notify_table_size_change != '\0') {
    uVar12 = deflater->min_hd_table_bufsize_max;
    deflater->notify_table_size_change = '\0';
    deflater->min_hd_table_bufsize_max = 0xffffffff;
    table_size = (deflater->ctx).hd_table_bufsize_max;
    if (uVar12 < table_size) {
      iVar3 = emit_table_size(bufs,uVar12);
      if (iVar3 != 0) goto LAB_004d6913;
      table_size = (deflater->ctx).hd_table_bufsize_max;
    }
    iVar3 = emit_table_size(bufs,table_size);
    if (iVar3 != 0) goto LAB_004d6913;
  }
  sVar7 = 0;
  do {
    if (sVar7 == nvlen) {
      return 0;
    }
    mem = (deflater->ctx).mem;
    name = nv[sVar7].name;
    sVar6 = nv[sVar7].namelen;
    uVar4 = lookup_token(name,sVar6);
    idx = (size_t)uVar4;
    if (uVar4 == 0xffffffff) {
      hash = 0x811c9dc5;
      for (sVar5 = 0; sVar6 != sVar5; sVar5 = sVar5 + 1) {
        hash = (hash ^ name[sVar5]) * 0x1000193;
      }
    }
    else {
      hash = 0;
      if (uVar4 < 0x3d) {
        hash = static_table[idx].hash;
      }
    }
    nv_00 = nv + sVar7;
    indexing_mode = 2;
    if ((uVar4 != 0x16) &&
       ((((uVar4 != 0x1f || (0x13 < nv_00->valuelen)) && ((nv_00->flags & 1) == 0)) &&
        ((0x36 < uVar4 || (indexing_mode = 1, (0x40218208100008U >> (idx & 0x3f) & 1) == 0)))))) {
      indexing_mode =
           (uint)((deflater->ctx).hd_table_bufsize_max * 3 >> 2 < nv_00->valuelen + sVar6 + 0x20);
    }
    pnVar9 = (nghttp2_hd_entry *)0x0;
    ppnVar8 = (deflater->map).table + (hash & 0x7f);
    while (pnVar1 = *ppnVar8, pnVar1 != (nghttp2_hd_entry *)0x0) {
      if (((pnVar1->nv).token == uVar4) &&
         ((uVar4 != 0xffffffff ||
          (((pnVar1->hash == hash && (pnVar2 = (pnVar1->nv).name, pnVar2->len == sVar6)) &&
           (iVar3 = memeq(pnVar2->base,name,sVar6), iVar3 != 0)))))) {
        pnVar11 = pnVar1;
        if (pnVar9 != (nghttp2_hd_entry *)0x0) {
          pnVar11 = pnVar9;
        }
        if ((indexing_mode == 2) &&
           (bVar13 = pnVar9 == (nghttp2_hd_entry *)0x0, pnVar9 = pnVar1, bVar13)) break;
        pnVar2 = (pnVar1->nv).value;
        sVar5 = pnVar2->len;
        pnVar9 = pnVar11;
        if ((sVar5 == nv_00->valuelen) &&
           (iVar3 = memeq(pnVar2->base,nv_00->value,sVar5), iVar3 != 0)) {
          bVar13 = false;
          pnVar9 = pnVar1;
          goto LAB_004d6b89;
        }
      }
      ppnVar8 = &pnVar1->next;
    }
    if (uVar4 < 0x3d) {
      if (indexing_mode != 2) {
        uVar12 = idx;
        for (ppuVar10 = &static_table[idx].value.base;
            ((int)uVar12 < 0x3d && (*(uint *)(ppuVar10 + 8) == uVar4)); ppuVar10 = ppuVar10 + 0x10)
        {
          if ((ppuVar10[1] == (uint8_t *)nv_00->valuelen) &&
             (iVar3 = bcmp(*ppuVar10,nv_00->value,(size_t)ppuVar10[1]), iVar3 == 0))
          goto LAB_004d6bb4;
          uVar12 = uVar12 + 1;
        }
LAB_004d6ba5:
        if (indexing_mode == 0) {
          nghttp2_hd_table_get(&local_48,&deflater->ctx,idx);
          hd_nv.name = local_48.name;
          nghttp2_rcbuf_incref(local_48.name);
LAB_004d6c30:
          iVar3 = nghttp2_rcbuf_new2(&hd_nv.value,nv_00->value,nv_00->valuelen,mem);
          if (iVar3 != 0) {
            nghttp2_rcbuf_decref(hd_nv.name);
            break;
          }
          hd_nv.flags = '\0';
          hd_nv.token = uVar4;
          iVar3 = add_hd_table_incremental(&deflater->ctx,&hd_nv,&deflater->map,hash);
          nghttp2_rcbuf_decref(hd_nv.value);
          nghttp2_rcbuf_decref(hd_nv.name);
          if (iVar3 != 0) {
            iVar3 = -0x20b;
            break;
          }
          if (idx == 0xffffffffffffffff) goto LAB_004d6cb8;
        }
      }
      iVar3 = emit_indname_block(bufs,idx,nv_00,indexing_mode);
    }
    else {
      bVar13 = true;
      if (pnVar9 == (nghttp2_hd_entry *)0x0) {
        if (indexing_mode == 0) {
          iVar3 = nghttp2_rcbuf_new2(&hd_nv.name,name,sVar6,mem);
          idx = 0xffffffffffffffff;
          if (iVar3 == 0) goto LAB_004d6c30;
          break;
        }
LAB_004d6cb8:
        iVar3 = emit_newname_block(bufs,nv_00,indexing_mode);
      }
      else {
LAB_004d6b89:
        idx = (size_t)((deflater->ctx).next_seq + ~pnVar9->seq + 0x3d);
        uVar12 = idx;
        if (bVar13) goto LAB_004d6ba5;
LAB_004d6bb4:
        sVar6 = count_encoded_length(uVar12 + 1,7);
        iVar3 = -0x20b;
        if (sVar6 < 0x11) {
          hd_nv.name = (nghttp2_rcbuf *)CONCAT71(hd_nv.name._1_7_,0x80);
          encode_length((uint8_t *)&hd_nv,uVar12 + 1,7);
          iVar3 = nghttp2_bufs_add(bufs,&hd_nv,sVar6);
        }
      }
    }
    sVar7 = sVar7 + 1;
  } while (iVar3 == 0);
LAB_004d6913:
  (deflater->ctx).bad = '\x01';
  return iVar3;
}

Assistant:

int nghttp2_hd_deflate_hd_bufs(nghttp2_hd_deflater *deflater,
                               nghttp2_bufs *bufs, const nghttp2_nv *nv,
                               size_t nvlen) {
  size_t i;
  int rv = 0;

  if (deflater->ctx.bad) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (deflater->notify_table_size_change) {
    size_t min_hd_table_bufsize_max;

    min_hd_table_bufsize_max = deflater->min_hd_table_bufsize_max;

    deflater->notify_table_size_change = 0;
    deflater->min_hd_table_bufsize_max = UINT32_MAX;

    if (deflater->ctx.hd_table_bufsize_max > min_hd_table_bufsize_max) {

      rv = emit_table_size(bufs, min_hd_table_bufsize_max);

      if (rv != 0) {
        goto fail;
      }
    }

    rv = emit_table_size(bufs, deflater->ctx.hd_table_bufsize_max);

    if (rv != 0) {
      goto fail;
    }
  }

  for (i = 0; i < nvlen; ++i) {
    rv = deflate_nv(deflater, bufs, &nv[i]);
    if (rv != 0) {
      goto fail;
    }
  }

  DEBUGF("deflatehd: all input name/value pairs were deflated\n");

  return 0;
fail:
  DEBUGF("deflatehd: error return %d\n", rv);

  deflater->ctx.bad = 1;
  return rv;
}